

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::RegexExtractBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  pointer pVVar1;
  pointer pcVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  bool bVar5;
  int iVar6;
  uint __val;
  reference pvVar7;
  type pEVar8;
  pointer pEVar9;
  iterator iVar10;
  long *plVar11;
  ParameterNotResolvedException *this_00;
  InvalidInputException *pIVar12;
  BinderException *pBVar13;
  long *plVar14;
  pointer this_01;
  bool constant_pattern;
  string group_name;
  RE2 constant_pattern_1;
  string group_string;
  child_list_t<LogicalType> struct_children;
  string constant_string;
  case_insensitive_set_t name_collision_set;
  Value group;
  StringPiece constant_piece;
  bool local_2d1;
  ScalarFunction *local_2d0;
  string local_2c8;
  undefined1 local_2a8 [32];
  LogicalTypeId local_288;
  int local_268;
  Options local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_1d8;
  vector<duckdb::Value,_true> *local_1c0;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_1b8;
  string local_1b0;
  child_list_t<LogicalType> local_190;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  Value local_80;
  StringPiece local_40;
  
  local_210.max_mem_ = 0x800000;
  local_210.encoding_ = EncodingUTF8;
  local_210.posix_syntax_ = false;
  local_210.longest_match_ = false;
  local_210.log_errors_ = true;
  local_210.literal_ = false;
  local_210.never_nl_ = false;
  local_210.dot_nl_ = false;
  local_210.never_capture_ = false;
  local_210.case_sensitive_ = true;
  local_210.perl_classes_ = false;
  local_210.word_boundary_ = false;
  local_210.one_line_ = false;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  local_1b0._M_string_length = 0;
  local_1b0.field_2._M_local_buf[0] = '\0';
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (pvVar7);
  bVar5 = regexp_util::TryParseConstantPattern(context,pEVar8,&local_1b0);
  local_2d1 = bVar5;
  if (0x18 < (ulong)((long)(arguments->
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ).
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(arguments->
                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ).
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,3);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar7);
    regexp_util::ParseRegexOptions(context,pEVar8,&local_210,(bool *)0x0);
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"\\0","");
  if (0x10 < (ulong)((long)(arguments->
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ).
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(arguments->
                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ).
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,2);
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    iVar6 = (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[6])(pEVar9);
    if ((char)iVar6 != '\0') {
      this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      ParameterNotResolvedException::ParameterNotResolvedException(this_00);
      __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,2);
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    iVar6 = (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar9);
    if ((char)iVar6 == '\0') {
      pIVar12 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_2a8._0_8_ = local_2a8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2a8,"Group specification field must be a constant!","");
      InvalidInputException::InvalidInputException(pIVar12,(string *)local_2a8);
      __cxa_throw(pIVar12,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,2);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar7);
    ExpressionExecutor::EvaluateScalar(&local_80,context,pEVar8,false);
    if (local_80.is_null == true) {
      ::std::__cxx11::string::_M_replace
                ((ulong)&local_1f8,0,(char *)local_1f8._M_string_length,0x1f53803);
    }
    else if (local_80.type_.id_ == LIST) {
      local_2d0 = bound_function;
      if (!bVar5) {
        pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
        local_2a8._0_8_ = local_2a8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,"%s with LIST requires a constant pattern","");
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        pcVar2 = (local_2d0->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
                 _M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,pcVar2,
                   pcVar2 + (local_2d0->super_BaseScalarFunction).super_SimpleFunction.
                            super_Function.name._M_string_length);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar13,(string *)local_2a8,&local_a0);
        __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_1c0 = ListValue::GetChildren(&local_80);
      local_1b8._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
      super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
           (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
           (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
      if ((local_1c0->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (local_1c0->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
        local_2a8._0_8_ = local_2a8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,"%s requires non-empty lists of capture names","");
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        pcVar2 = (local_2d0->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
                 _M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,pcVar2,
                   pcVar2 + (local_2d0->super_BaseScalarFunction).super_SimpleFunction.
                            super_Function.name._M_string_length);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar13,(string *)local_2a8,&local_c0);
        __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_178._M_buckets = &local_178._M_single_bucket;
      local_178._M_bucket_count = 1;
      local_178._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_178._M_element_count = 0;
      local_178._M_rehash_policy._M_max_load_factor = 1.0;
      local_178._M_rehash_policy._M_next_resize = 0;
      local_178._M_single_bucket = (__node_base_ptr)0x0;
      local_1d8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_01 = (local_1c0->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar1 = (local_1c0->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (this_01 != pVVar1) {
        do {
          if (this_01->is_null == true) {
            pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
            local_2a8._0_8_ = local_2a8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2a8,"NULL group name in %s","");
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            pcVar2 = (local_2d0->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
                     _M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e0,pcVar2,
                       pcVar2 + (local_2d0->super_BaseScalarFunction).super_SimpleFunction.
                                super_Function.name._M_string_length);
            BinderException::BinderException<std::__cxx11::string>
                      (pBVar13,(string *)local_2a8,&local_e0);
            __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          Value::ToString_abi_cxx11_(&local_2c8,this_01);
          iVar10 = ::std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find(&local_178,&local_2c8);
          if (iVar10.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
            local_2a8._0_8_ = local_2a8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2a8,"Duplicate group name \"%s\" in %s","");
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_100,local_2c8._M_dataplus._M_p,
                       local_2c8._M_dataplus._M_p + local_2c8._M_string_length);
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            pcVar2 = (local_2d0->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
                     _M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_120,pcVar2,
                       pcVar2 + (local_2d0->super_BaseScalarFunction).super_SimpleFunction.
                                super_Function.name._M_string_length);
            BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                      (pBVar13,(string *)local_2a8,&local_100,&local_120);
            __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          local_2a8._0_8_ = &local_178;
          ::std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&local_178,&local_2c8,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalTypeId>
                      *)local_2a8);
          local_2a8._0_8_ = local_2a8 + 0x10;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2a8,local_2c8._M_dataplus._M_p,
                     local_2c8._M_dataplus._M_p + local_2c8._M_string_length);
          local_288 = VARCHAR;
          ::std::
          vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
          ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalTypeId>>
                    ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                      *)&local_1d8,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalTypeId>
                      *)local_2a8);
          if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
            operator_delete((void *)local_2a8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p);
          }
          this_01 = this_01 + 1;
        } while (this_01 != pVVar1);
      }
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                *)&local_190,&local_1d8);
      LogicalType::STRUCT((LogicalType *)local_2a8,&local_190);
      this = (duckdb *)
             local_1b8._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
      (local_2d0->super_BaseScalarFunction).return_type.id_ = (LogicalTypeId)local_2a8[0];
      (local_2d0->super_BaseScalarFunction).return_type.physical_type_ = local_2a8[1];
      peVar3 = (local_2d0->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var4 = (local_2d0->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (local_2d0->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_2a8._8_8_;
      (local_2d0->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._16_8_;
      local_2a8._8_8_ = peVar3;
      local_2a8._16_8_ = p_Var4;
      LogicalType::~LogicalType((LogicalType *)local_2a8);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&local_190);
      local_40.data_ = local_1b0._M_dataplus._M_p;
      local_40.size_ = local_1b0._M_string_length;
      duckdb_re2::RE2::RE2((RE2 *)local_2a8,&local_40,&local_210);
      if ((ulong)(long)local_268 <
          (ulong)((long)(local_1c0->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(local_1c0->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_start >> 6)) {
        pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2c8,"Not enough group names in %s","");
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        pcVar2 = (local_2d0->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
                 _M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,pcVar2,
                   pcVar2 + (local_2d0->super_BaseScalarFunction).super_SimpleFunction.
                            super_Function.name._M_string_length);
        BinderException::BinderException<std::__cxx11::string>(pBVar13,&local_2c8,&local_140);
        __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      duckdb_re2::RE2::~RE2((RE2 *)local_2a8);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&local_1d8);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_178);
    }
    else {
      __val = Value::GetValue<int>(&local_80);
      if (9 < __val) {
        pIVar12 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_2a8._0_8_ = local_2a8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,"Group index must be between 0 and 9!","");
        InvalidInputException::InvalidInputException(pIVar12,(string *)local_2a8);
        __cxa_throw(pIVar12,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_178._M_buckets = &local_178._M_before_begin._M_nxt;
      ::std::__cxx11::string::_M_construct((ulong)&local_178,'\x01');
      ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_178._M_buckets,1,__val);
      plVar11 = (long *)::std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,0x1ef50d2);
      plVar14 = plVar11 + 2;
      if ((long *)*plVar11 == plVar14) {
        local_2a8._16_8_ = *plVar14;
        local_2a8._24_8_ = plVar11[3];
        local_2a8._0_8_ = local_2a8 + 0x10;
      }
      else {
        local_2a8._16_8_ = *plVar14;
        local_2a8._0_8_ = (long *)*plVar11;
      }
      local_2a8._8_8_ = plVar11[1];
      *plVar11 = (long)plVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_2a8);
      if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
        operator_delete((void *)local_2a8._0_8_);
      }
      if ((__node_base *)local_178._M_buckets != &local_178._M_before_begin) {
        operator_delete(local_178._M_buckets);
      }
    }
    Value::~Value(&local_80);
  }
  make_uniq<duckdb::RegexpExtractBindData,duckdb_re2::RE2::Options&,std::__cxx11::string,bool&,std::__cxx11::string>
            ((duckdb *)local_2a8,&local_210,&local_1b0,&local_2d1,&local_1f8);
  *(undefined8 *)this = local_2a8._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> RegexExtractBind(ClientContext &context, ScalarFunction &bound_function,
                                                 vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(arguments.size() >= 2);

	duckdb_re2::RE2::Options options;

	string constant_string;
	bool constant_pattern = TryParseConstantPattern(context, *arguments[1], constant_string);

	if (arguments.size() >= 4) {
		ParseRegexOptions(context, *arguments[3], options);
	}

	string group_string = "\\0";
	if (arguments.size() >= 3) {
		if (arguments[2]->HasParameter()) {
			throw ParameterNotResolvedException();
		}
		if (!arguments[2]->IsFoldable()) {
			throw InvalidInputException("Group specification field must be a constant!");
		}
		Value group = ExpressionExecutor::EvaluateScalar(context, *arguments[2]);
		if (group.IsNull()) {
			group_string = "";
		} else if (group.type().id() == LogicalTypeId::LIST) {
			if (!constant_pattern) {
				throw BinderException("%s with LIST requires a constant pattern", bound_function.name);
			}
			auto &list_children = ListValue::GetChildren(group);
			if (list_children.empty()) {
				throw BinderException("%s requires non-empty lists of capture names", bound_function.name);
			}
			case_insensitive_set_t name_collision_set;
			child_list_t<LogicalType> struct_children;
			for (const auto &child : list_children) {
				if (child.IsNull()) {
					throw BinderException("NULL group name in %s", bound_function.name);
				}
				const auto group_name = child.ToString();
				if (name_collision_set.find(group_name) != name_collision_set.end()) {
					throw BinderException("Duplicate group name \"%s\" in %s", group_name, bound_function.name);
				}
				name_collision_set.insert(group_name);
				struct_children.emplace_back(make_pair(group_name, LogicalType::VARCHAR));
			}
			bound_function.return_type = LogicalType::STRUCT(struct_children);

			duckdb_re2::StringPiece constant_piece(constant_string.c_str(), constant_string.size());
			RE2 constant_pattern(constant_piece, options);
			if (size_t(constant_pattern.NumberOfCapturingGroups()) < list_children.size()) {
				throw BinderException("Not enough group names in %s", bound_function.name);
			}
		} else {
			auto group_idx = group.GetValue<int32_t>();
			if (group_idx < 0 || group_idx > 9) {
				throw InvalidInputException("Group index must be between 0 and 9!");
			}
			group_string = "\\" + to_string(group_idx);
		}
	}

	return make_uniq<RegexpExtractBindData>(options, std::move(constant_string), constant_pattern,
	                                        std::move(group_string));
}